

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void __thiscall TCLAP::CmdLine::CmdLine(CmdLine *this,string *m,char delim,string *v,bool help)

{
  allocator local_2a;
  byte local_29;
  string *psStack_28;
  bool help_local;
  string *v_local;
  string *psStack_18;
  char delim_local;
  string *m_local;
  CmdLine *this_local;
  
  local_29 = help;
  psStack_28 = v;
  v_local._7_1_ = delim;
  psStack_18 = m;
  m_local = (string *)this;
  CmdLineInterface::CmdLineInterface(&this->super_CmdLineInterface);
  (this->super_CmdLineInterface)._vptr_CmdLineInterface = (_func_int **)&PTR__CmdLine_0013b2a8;
  (this->_argList).super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  (this->_argList).super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  (this->_argList).super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
  _M_size = 0;
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::list(&this->_argList);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->_progName,"not_set_yet",&local_2a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  std::__cxx11::string::string((string *)&this->_message,(string *)psStack_18);
  std::__cxx11::string::string((string *)&this->_version,(string *)psStack_28);
  this->_numRequired = 0;
  this->_delimiter = v_local._7_1_;
  XorHandler::XorHandler(&this->_xorHandler);
  (this->_argDeleteOnExitList).super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl
  ._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (this->_argDeleteOnExitList).super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl
  ._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  (this->_argDeleteOnExitList).super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl
  ._M_node._M_size = 0;
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::list(&this->_argDeleteOnExitList)
  ;
  (this->_visitorDeleteOnExitList).
  super__List_base<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  (this->_visitorDeleteOnExitList).
  super__List_base<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  (this->_visitorDeleteOnExitList).
  super__List_base<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_>::list
            (&this->_visitorDeleteOnExitList);
  this->_output = (CmdLineOutput *)0x0;
  this->_handleExceptions = true;
  this->_userSetOutput = false;
  this->_helpAndVersion = (bool)(local_29 & 1);
  this->_ignoreUnmatched = false;
  _constructor(this);
  return;
}

Assistant:

inline CmdLine::CmdLine(const std::string& m,
                        char delim,
                        const std::string& v,
                        bool help )
    :
  _argList(std::list<Arg*>()),
  _progName("not_set_yet"),
  _message(m),
  _version(v),
  _numRequired(0),
  _delimiter(delim),
  _xorHandler(XorHandler()),
  _argDeleteOnExitList(std::list<Arg*>()),
  _visitorDeleteOnExitList(std::list<Visitor*>()),
  _output(0),
  _handleExceptions(true),
  _userSetOutput(false),
  _helpAndVersion(help),
  _ignoreUnmatched(false)
{
	_constructor();
}